

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O0

void Cbs_ManDeriveReason(Cbs_Man_t *p,int Level)

{
  Gia_Obj_t *pVar;
  int iVar1;
  Cbs_Que_t *p_00;
  Gia_Obj_t *pGVar2;
  ulong *puVar3;
  int local_38;
  int iLitLevel;
  int k;
  int i;
  Gia_Obj_t *pReason;
  Gia_Obj_t *pObj;
  Cbs_Que_t *pQue;
  int Level_local;
  Cbs_Man_t *p_local;
  
  p_00 = &p->pClauses;
  if ((p->pClauses).pData[p_00->iHead] != (Gia_Obj_t *)0x0) {
    __assert_fail("pQue->pData[pQue->iHead] == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSat.c"
                  ,0x250,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
  }
  if (p_00->iHead + 1 < (p->pClauses).iTail) {
    Vec_PtrClear(p->vTemp);
    local_38 = p_00->iHead + 1;
    iLitLevel = local_38;
    do {
      if ((p->pClauses).iTail <= iLitLevel) {
        if ((p->pClauses).pData[p_00->iHead] != (Gia_Obj_t *)0x0) {
          (p->pClauses).iTail = local_38;
          for (iLitLevel = 0; iVar1 = Vec_PtrSize(p->vTemp), iLitLevel < iVar1;
              iLitLevel = iLitLevel + 1) {
            puVar3 = (ulong *)Vec_PtrEntry(p->vTemp,iLitLevel);
            *puVar3 = *puVar3 & 0xffffffffbfffffff | 0x40000000;
          }
          return;
        }
        __assert_fail("pQue->pData[pQue->iHead] != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSat.c"
                      ,0x277,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
      }
      pVar = (p->pClauses).pData[iLitLevel];
      if ((*(ulong *)pVar >> 0x1e & 1) != 0) {
        *(ulong *)pVar = *(ulong *)pVar & 0xffffffffbfffffff;
        Vec_PtrPush(p->vTemp,pVar);
        iVar1 = Cbs_VarDecLevel(p,pVar);
        if (iVar1 < Level) {
          (p->pClauses).pData[local_38] = pVar;
          local_38 = local_38 + 1;
        }
        else {
          if (iVar1 != Level) {
            __assert_fail("iLitLevel == Level",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSat.c"
                          ,0x26a,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
          }
          pGVar2 = Cbs_VarReason0(p,pVar);
          if (pGVar2 == pVar) {
            if ((p->pClauses).pData[p_00->iHead] != (Gia_Obj_t *)0x0) {
              __assert_fail("pQue->pData[pQue->iHead] == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSat.c"
                            ,0x26e,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
            }
            (p->pClauses).pData[p_00->iHead] = pVar;
          }
          else {
            Cbs_QuePush(p_00,pGVar2);
            pGVar2 = Cbs_VarReason1(p,pVar);
            if (pGVar2 != pVar) {
              Cbs_QuePush(p_00,pGVar2);
            }
          }
        }
      }
      iLitLevel = iLitLevel + 1;
    } while( true );
  }
  __assert_fail("pQue->iHead + 1 < pQue->iTail",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSat.c"
                ,0x251,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
}

Assistant:

static inline void Cbs_ManDeriveReason( Cbs_Man_t * p, int Level )
{
    Cbs_Que_t * pQue = &(p->pClauses);
    Gia_Obj_t * pObj, * pReason;
    int i, k, iLitLevel;
    assert( pQue->pData[pQue->iHead] == NULL );
    assert( pQue->iHead + 1 < pQue->iTail );
/*
    for ( i = pQue->iHead + 1; i < pQue->iTail; i++ )
    {
        pObj = pQue->pData[i];
        assert( pObj->fMark0 == 1 );
    }
*/
    // compact literals
    Vec_PtrClear( p->vTemp );
    for ( i = k = pQue->iHead + 1; i < pQue->iTail; i++ )
    {
        pObj = pQue->pData[i];
        if ( !pObj->fMark0 ) // unassigned - seen again
            continue;
        // assigned - seen first time
        pObj->fMark0 = 0;
        Vec_PtrPush( p->vTemp, pObj );
        // check decision level
        iLitLevel = Cbs_VarDecLevel( p, pObj );
        if ( iLitLevel < Level )
        {
            pQue->pData[k++] = pObj;
            continue;
        }
        assert( iLitLevel == Level );
        pReason = Cbs_VarReason0( p, pObj );
        if ( pReason == pObj ) // no reason
        {
            assert( pQue->pData[pQue->iHead] == NULL );
            pQue->pData[pQue->iHead] = pObj;
            continue;
        }
        Cbs_QuePush( pQue, pReason );
        pReason = Cbs_VarReason1( p, pObj );
        if ( pReason != pObj ) // second reason
            Cbs_QuePush( pQue, pReason );
    }
    assert( pQue->pData[pQue->iHead] != NULL );
    pQue->iTail = k;
    // clear the marks
    Vec_PtrForEachEntry( Gia_Obj_t *, p->vTemp, pObj, i )
        pObj->fMark0 = 1;
}